

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstractscrollarea.cpp
# Opt level: O0

void __thiscall
QtMWidgets::AbstractScrollAreaPrivate::normalizePosition(AbstractScrollAreaPrivate *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  QPoint local_20;
  QPoint maxPos;
  QSize s;
  AbstractScrollAreaPrivate *this_local;
  
  iVar1 = QPoint::x(&this->topLeftCorner);
  if (iVar1 < 0) {
    QPoint::setX(&this->topLeftCorner,0);
  }
  iVar1 = QPoint::y(&this->topLeftCorner);
  if (iVar1 < 0) {
    QPoint::setY(&this->topLeftCorner,0);
  }
  maxPos = (QPoint)QWidget::size(this->viewport);
  iVar1 = QSize::width(&this->scrolledAreaSize);
  iVar2 = QSize::width((QSize *)&maxPos);
  iVar3 = QSize::height(&this->scrolledAreaSize);
  iVar4 = QSize::height((QSize *)&maxPos);
  QPoint::QPoint(&local_20,iVar1 - iVar2,iVar3 - iVar4);
  iVar1 = QSize::width(&this->scrolledAreaSize);
  iVar2 = QSize::width((QSize *)&maxPos);
  if (iVar2 < iVar1) {
    iVar1 = QPoint::x(&local_20);
    iVar2 = QPoint::x(&this->topLeftCorner);
    if (iVar1 < iVar2) {
      iVar1 = QPoint::x(&local_20);
      QPoint::setX(&this->topLeftCorner,iVar1);
    }
  }
  else {
    QPoint::setX(&this->topLeftCorner,0);
  }
  iVar1 = QSize::height(&this->scrolledAreaSize);
  iVar2 = QSize::height((QSize *)&maxPos);
  if (iVar2 < iVar1) {
    iVar1 = QPoint::y(&local_20);
    iVar2 = QPoint::y(&this->topLeftCorner);
    if (iVar1 < iVar2) {
      iVar1 = QPoint::y(&local_20);
      QPoint::setY(&this->topLeftCorner,iVar1);
    }
  }
  else {
    QPoint::setY(&this->topLeftCorner,0);
  }
  return;
}

Assistant:

void
AbstractScrollAreaPrivate::normalizePosition()
{
	if( topLeftCorner.x() < 0 )
		topLeftCorner.setX( 0 );

	if( topLeftCorner.y() < 0 )
		topLeftCorner.setY( 0 );

	const QSize s = viewport->size();

	const QPoint maxPos = QPoint( scrolledAreaSize.width() - s.width(),
		scrolledAreaSize.height() - s.height() );

	if( scrolledAreaSize.width() > s.width() )
	{
		if( maxPos.x() < topLeftCorner.x() )
			topLeftCorner.setX( maxPos.x() );
	}
	else
		topLeftCorner.setX( 0 );

	if( scrolledAreaSize.height() > s.height() )
	{
		if( maxPos.y() < topLeftCorner.y() )
			topLeftCorner.setY( maxPos.y() );
	}
	else
		topLeftCorner.setY( 0 );
}